

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O2

void __thiscall CTPNVarInRange::gen_code(CTPNVarInRange *this,int param_1,int param_2)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcPrsNode *pCVar2;
  CTcSymLocal *this_00;
  size_t siz;
  
  (*(((this->super_CTPNVarInRangeBase).lval_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x12])();
  iVar1 = (*(((this->super_CTPNVarInRangeBase).to_expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
            [1])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    pCVar2 = (this->super_CTPNVarInRangeBase).to_expr_;
    (**(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar2,0,0);
    CTcSymLocal::s_gen_code_setlcl_stk((this->super_CTPNVarInRangeBase).to_local_id_,0);
  }
  pCVar2 = (this->super_CTPNVarInRangeBase).step_expr_;
  if (pCVar2 != (CTcPrsNode *)0x0) {
    iVar1 = (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    if (CONCAT44(extraout_var_00,iVar1) == 0) {
      pCVar2 = (this->super_CTPNVarInRangeBase).step_expr_;
      (**(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar2,0,0);
      siz = 0;
      CTcSymLocal::s_gen_code_setlcl_stk((this->super_CTPNVarInRangeBase).step_local_id_,0);
      pCVar2 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,siz);
      this_00 = (CTcSymLocal *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x68,siz);
      CTcSymLocal::CTcSymLocal
                (this_00,".step",5,0,0,(this->super_CTPNVarInRangeBase).step_local_id_);
      pCVar2[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)this_00;
      (pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00353a00;
      (this->super_CTPNVarInRangeBase).step_expr_ = pCVar2;
    }
  }
  return;
}

Assistant:

void CTPNVarInRange::gen_code(int, int)
{
    /* assign the 'from' expression to the lvalue */
    lval_->gen_code_asi(TRUE, 1, TC_ASI_SIMPLE, "=", from_expr_,
                        FALSE, TRUE, 0);

    /* 
     *   if the 'to' expression is non-constant, evaluate it and save it in a
     *   local, so that we don't have to re-evaluate it on each iteration 
     */
    if (!to_expr_->is_const())
    {
        /* evaluate the 'to' expression */
        to_expr_->gen_code(FALSE, FALSE);

        /* assign it to our stack local */
        CTcSymLocal::s_gen_code_setlcl_stk(to_local_id_, FALSE);
    }

    /* 
     *   likewise, if there's a non-constant 'step' expression, evaluate it
     *   and store it in our step stack local 
     */
    if (step_expr_ != 0 && !step_expr_->is_const())
    {
        /* generate the step expression value */
        step_expr_->gen_code(FALSE, FALSE);

        /* generate the assignment to our local */
        CTcSymLocal::s_gen_code_setlcl_stk(step_local_id_, FALSE);

        /* replace the step expression with the local */
        step_expr_ = new CTPNSymResolved(new CTcSymLocal(
            ".step", 5, FALSE, FALSE, step_local_id_));
    }
}